

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool __thiscall
basist::ktx2_transcoder::get_image_level_info
          (ktx2_transcoder *this,ktx2_image_level_info *level_info,uint32_t level_index,
          uint32_t layer_index,uint32_t face_index)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  
  if (level_index < (this->m_levels).m_size) {
    if (*(uint *)(this->m_header).m_face_count.m_bytes < 2) {
      if (face_index != 0) {
        return false;
      }
    }
    else if (5 < face_index) {
      return false;
    }
    iVar1 = *(int *)(this->m_header).m_layer_count.m_bytes;
    if (layer_index < iVar1 + (uint)(iVar1 == 0)) {
      uVar2 = *(uint *)(this->m_header).m_pixel_width.m_bytes >> ((byte)level_index & 0x1f);
      uVar3 = uVar2 + (uVar2 == 0);
      uVar2 = *(uint *)(this->m_header).m_pixel_height.m_bytes >> ((byte)level_index & 0x1f);
      uVar5 = uVar2 + (uVar2 == 0);
      uVar2 = uVar3 + 3;
      uVar7 = uVar2 >> 2;
      uVar6 = uVar5 + 3;
      uVar4 = uVar6 >> 2;
      level_info->m_face_index = face_index;
      level_info->m_layer_index = layer_index;
      level_info->m_level_index = level_index;
      level_info->m_orig_width = uVar3;
      level_info->m_orig_height = uVar5;
      level_info->m_width = uVar2 & 0xfffffffc;
      level_info->m_height = uVar6 & 0xfffffffc;
      level_info->m_num_blocks_x = uVar7;
      level_info->m_num_blocks_y = uVar4;
      level_info->m_total_blocks = uVar4 * uVar7;
      level_info->m_alpha_flag = this->m_has_alpha;
      level_info->m_iframe_flag = false;
      uVar2 = (this->m_etc1s_image_descs).m_size;
      if (uVar2 == 0) {
        return true;
      }
      iVar1 = *(int *)(this->m_header).m_layer_count.m_bytes;
      uVar6 = ((iVar1 + (uint)(iVar1 == 0)) * level_index + layer_index) *
              *(int *)(this->m_header).m_face_count.m_bytes + face_index;
      if (uVar2 <= uVar6) {
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                      ,0x177,
                      "const T &basisu::vector<basist::ktx2_etc1s_image_desc>::operator[](size_t) const [T = basist::ktx2_etc1s_image_desc]"
                     );
      }
      level_info->m_iframe_flag =
           ((this->m_etc1s_image_descs).m_p[uVar6].m_image_flags.m_bytes[0] & 2) == 0;
      return true;
    }
  }
  return false;
}

Assistant:

bool ktx2_transcoder::get_image_level_info(ktx2_image_level_info& level_info, uint32_t level_index, uint32_t layer_index, uint32_t face_index) const
	{
		if (level_index >= m_levels.size())
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: level_index >= m_levels.size()\n");
			return false;
		}

		if (m_header.m_face_count > 1)
		{
			if (face_index >= 6)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: face_index >= 6\n");
				return false;
			}
		}
		else if (face_index != 0)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: face_index != 0\n");
			return false;
		}

		if (layer_index >= basisu::maximum<uint32_t>(m_header.m_layer_count, 1))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: layer_index >= maximum<uint32_t>(m_header.m_layer_count, 1)\n");
			return false;
		}
				
		const uint32_t level_width = basisu::maximum<uint32_t>(m_header.m_pixel_width >> level_index, 1);
		const uint32_t level_height = basisu::maximum<uint32_t>(m_header.m_pixel_height >> level_index, 1);
		const uint32_t num_blocks_x = (level_width + 3) >> 2;
		const uint32_t num_blocks_y = (level_height + 3) >> 2;

		level_info.m_face_index = face_index;
		level_info.m_layer_index = layer_index;
		level_info.m_level_index = level_index;
		level_info.m_orig_width = level_width;
		level_info.m_orig_height = level_height;
		level_info.m_width = num_blocks_x * 4;
		level_info.m_height = num_blocks_y * 4;
		level_info.m_num_blocks_x = num_blocks_x;
		level_info.m_num_blocks_y = num_blocks_y;
		level_info.m_total_blocks = num_blocks_x * num_blocks_y;
		level_info.m_alpha_flag = m_has_alpha;
		level_info.m_iframe_flag = false;
		if (m_etc1s_image_descs.size())
		{
			const uint32_t etc1s_image_index =
				(level_index * basisu::maximum<uint32_t>(m_header.m_layer_count, 1) * m_header.m_face_count) +
				layer_index * m_header.m_face_count +
				face_index;

			level_info.m_iframe_flag = (m_etc1s_image_descs[etc1s_image_index].m_image_flags & KTX2_IMAGE_IS_P_FRAME) == 0;
		}

		return true;
	}